

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintdialog_unix.cpp
# Opt level: O3

void __thiscall QPrintDialog::QPrintDialog(QPrintDialog *this,QWidget *parent)

{
  QAbstractPrintDialogPrivate *ptr;
  
  ptr = (QAbstractPrintDialogPrivate *)operator_new(0x4b8);
  QDialogPrivate::QDialogPrivate((QDialogPrivate *)ptr);
  (ptr->memberToDisconnectOnClose).d.d = (Data *)0x0;
  (ptr->memberToDisconnectOnClose).d.ptr = (char *)0x0;
  (ptr->receiverToDisconnectOnClose).wp.d = (Data *)0x0;
  (ptr->receiverToDisconnectOnClose).wp.value = (QObject *)0x0;
  ptr->printer = (QPrinter *)0x0;
  ptr->pd = (QPrinterPrivate *)0x0;
  (ptr->memberToDisconnectOnClose).d.size = 0;
  ptr->options = (QFlagsStorageHelper<QAbstractPrintDialog::PrintDialogOption,_4>)0x1d;
  ptr->minPage = 0;
  ptr->maxPage = 0x7fffffff;
  ptr->ownsPrinter = false;
  *(undefined ***)ptr = &PTR__QPrintDialogPrivate_00167628;
  *(undefined8 *)&ptr[1].field_0x168 = 0;
  *(undefined8 *)&ptr[1].field_0x170 = 0;
  *(undefined8 *)&ptr[1].field_0x178 = 0;
  *(undefined8 *)&ptr[1].field_0x180 = 0;
  *(undefined4 *)&ptr[1].field_0x18c = 1;
  qInitResources_qprintdialog();
  QAbstractPrintDialog::QAbstractPrintDialog
            ((QAbstractPrintDialog *)this,ptr,(QPrinter *)0x0,parent);
  *(undefined ***)this = &PTR_metaObject_00167710;
  *(undefined ***)(this + 0x10) = &PTR__QPrintDialog_001678e8;
  QPrintDialogPrivate::init(*(QPrintDialogPrivate **)(this + 8),(EVP_PKEY_CTX *)ptr);
  return;
}

Assistant:

QPrintDialog::QPrintDialog(QWidget *parent)
    : QAbstractPrintDialog(*(new QPrintDialogPrivate), nullptr, parent)
{
    Q_D(QPrintDialog);
    d->init();
}